

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_dermassfrac(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                       Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  
  iVar1 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar9 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
  lVar29 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
  iVar3 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar27 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar5) + 1);
  lVar16 = (long)(bx->smallend).vect[2];
  lVar21 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  lVar18 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar4) + 1);
  lVar22 = (long)(bx->smallend).vect[1];
  iVar6 = (bx->smallend).vect[0];
  lVar15 = (long)iVar6;
  lVar25 = ((lVar16 * 8 + dcomp * lVar27 * 8 + (long)iVar5 * -8) * lVar18 + lVar22 * 8 +
           (long)iVar4 * -8) * lVar21 + lVar15 * 8 + (long)iVar3 * -8 +
           (long)(derfab->super_BaseFab<double>).dptr;
  pdVar8 = (datfab->super_BaseFab<double>).dptr;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar17 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
  iVar4 = (bx->bigend).vect[0];
  lVar23 = ((lVar29 * 8 + lVar16 * 8 + (long)iVar2 * -8) * lVar9 + lVar22 * 8 + (long)iVar1 * -8) *
           lVar17 + lVar15 * 8 + (long)iVar3 * -8 + (long)pdVar8;
  iVar5 = (bx->bigend).vect[1];
  iVar7 = (bx->bigend).vect[2];
  lVar18 = lVar18 * lVar21;
  lVar10 = lVar9 * lVar17 * 8;
  lVar11 = 0;
  while (lVar11 != 9) {
    lVar11 = lVar11 + 1;
    lVar14 = (lVar22 * 8 + (lVar16 - iVar2) * lVar9 * 8 + (long)iVar1 * -8) * lVar17 + lVar15 * 8 +
             (long)iVar3 * -8 + (long)pdVar8;
    lVar24 = lVar23;
    lVar26 = lVar25;
    for (lVar13 = lVar16; lVar19 = lVar22, lVar20 = lVar24, lVar28 = lVar14, lVar30 = lVar26,
        lVar13 <= iVar7; lVar13 = lVar13 + 1) {
      for (; lVar19 <= iVar5; lVar19 = lVar19 + 1) {
        if (iVar6 <= iVar4) {
          lVar12 = 0;
          do {
            *(double *)(lVar30 + lVar12 * 8) =
                 (1.0 / *(double *)(lVar28 + lVar12 * 8)) * *(double *)(lVar20 + lVar12 * 8);
            lVar12 = lVar12 + 1;
          } while ((iVar4 - iVar6) + 1 != (int)lVar12);
        }
        lVar20 = lVar20 + lVar17 * 8;
        lVar28 = lVar28 + lVar17 * 8;
        lVar30 = lVar30 + lVar21 * 8;
      }
      lVar26 = lVar26 + lVar18 * 8;
      lVar24 = lVar24 + lVar10;
      lVar14 = lVar14 + lVar10;
    }
    lVar25 = lVar25 + lVar27 * lVar18 * 8;
    lVar23 = lVar23 + lVar29 * lVar9 * lVar17 * 8;
  }
  return;
}

Assistant:

void pelelm_dermassfrac (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == NUM_SPECIES);
    auto const in_dat = datfab.array();
    auto       der = derfab.array(dcomp);
    amrex::ParallelFor(bx, NUM_SPECIES,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        amrex::Real rhoinv = 1.0 / in_dat(i,j,k,0);
        der(i,j,k,n) = in_dat(i,j,k,n+1) * rhoinv;
    });
}